

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateVariableAccess(ExpressionEvalContext *ctx,ExprVariableAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *pEVar6;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar6 = (ExprBase *)0x0;
      target = FindVariableStorage(ctx,expression->variable,false);
      if (target != (ExprPointerLiteral *)0x0) {
        pEVar6 = CreateLoad(ctx,&target->super_ExprBase);
        if (pEVar6 != (ExprBase *)0x0) {
          pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
          return pEVar6;
        }
        pEVar6 = (ExprBase *)0x0;
      }
    }
    else {
      pEVar6 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
  }
  return pEVar6;
}

Assistant:

ExprBase* EvaluateVariableAccess(ExpressionEvalContext &ctx, ExprVariableAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->variable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}